

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O2

BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_> __thiscall
OpenMesh::PropertyContainer::add<OpenMesh::VectorT<unsigned_char,3>>
          (PropertyContainer *this,VectorT<unsigned_char,_3> *param_1,string *_name)

{
  pointer ppBVar1;
  pointer ppBVar2;
  PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *this_00;
  long lVar3;
  BaseProperty *local_30;
  
  ppBVar2 = (this->properties_).
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->properties_).
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = 0;
  do {
    if (ppBVar2 == ppBVar1) {
LAB_0018b664:
      local_30 = (BaseProperty *)0x0;
      std::vector<OpenMesh::BaseProperty*,std::allocator<OpenMesh::BaseProperty*>>::
      emplace_back<OpenMesh::BaseProperty*>
                ((vector<OpenMesh::BaseProperty*,std::allocator<OpenMesh::BaseProperty*>> *)
                 &this->properties_,&local_30);
LAB_0018b674:
      this_00 = (PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *)operator_new(0x48);
      PropertyT<OpenMesh::VectorT<unsigned_char,_3>_>::PropertyT(this_00,_name);
      (this->properties_).
      super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar3] = (BaseProperty *)this_00;
      return (BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>)SUB84(lVar3,0);
    }
    if (*ppBVar2 == (BaseProperty *)0x0) {
      if (ppBVar2 != ppBVar1) goto LAB_0018b674;
      goto LAB_0018b664;
    }
    ppBVar2 = ppBVar2 + 1;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

BasePropHandleT<T> add(const T&, const std::string& _name="<unknown>")
  {
    Properties::iterator p_it=properties_.begin(), p_end=properties_.end();
    int idx=0;
    for ( ; p_it!=p_end && *p_it!=NULL; ++p_it, ++idx ) {};
    if (p_it==p_end) properties_.push_back(NULL);
    properties_[idx] = new PropertyT<T>(_name);
    return BasePropHandleT<T>(idx);
  }